

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.c
# Opt level: O0

int output_instruction(Function *fn,Instruction *insn)

{
  FILE *__stream;
  char *pcVar1;
  int local_1c;
  int rc;
  Instruction *insn_local;
  Function *fn_local;
  
  raviX_buffer_reset(&fn->tb);
  raviX_output_instruction(insn,&fn->tb);
  raviX_buffer_add_fstring(&fn->body,"// %s\n",(fn->tb).buf);
  raviX_buffer_reset(&fn->tb);
  __stream = _stderr;
  switch(*(undefined1 *)insn) {
  case 1:
    local_1c = emit_op_ret(fn,insn);
    break;
  case 2:
  case 6:
  case 0xb:
    local_1c = emit_op_arith(fn,insn);
    break;
  case 3:
  case 5:
  case 7:
  case 10:
  case 0xc:
  case 0xe:
  case 0x10:
  case 0x13:
  case 0x16:
  case 0x18:
  case 0x1a:
    local_1c = emit_bin_ii(fn,insn);
    break;
  case 4:
  case 8:
  case 0xd:
  case 0x11:
    local_1c = emit_bin_fi(fn,insn);
    break;
  case 9:
  case 0x12:
    local_1c = emit_bin_if(fn,insn);
    break;
  case 0xf:
  case 0x14:
  case 0x15:
  case 0x17:
  case 0x19:
  case 0x1b:
  case 0x1d:
  case 0x28:
  case 0x29:
    local_1c = emit_op_binary(fn,insn);
    break;
  case 0x1c:
  case 0x1e:
    local_1c = emit_bitop_ii(fn,insn);
    break;
  case 0x1f:
  case 0x22:
  case 0x25:
    local_1c = emit_generic_comp(fn,insn);
    break;
  case 0x20:
  case 0x21:
  case 0x23:
  case 0x24:
  case 0x26:
  case 0x27:
    local_1c = emit_comp_ii(fn,insn);
    break;
  case 0x2a:
    local_1c = emit_op_closure(fn,insn);
    break;
  case 0x2b:
    local_1c = emit_op_unm(fn,insn);
    break;
  case 0x2c:
  case 0x2d:
    local_1c = emit_op_unmi_unmf(fn,insn);
    break;
  case 0x2e:
  case 0x2f:
    local_1c = emit_op_len(fn,insn);
    break;
  case 0x30:
  case 0x32:
  case 0x33:
  case 0x34:
  case 0x35:
  case 0x36:
    local_1c = emit_op_totype(fn,insn);
    break;
  case 0x31:
    local_1c = emit_op_toflt(fn,insn);
    break;
  case 0x37:
    local_1c = emit_op_tousertype(fn,insn);
    break;
  case 0x38:
    local_1c = emit_op_not(fn,insn);
    break;
  case 0x39:
    local_1c = emit_op_bnot(fn,insn);
    break;
  case 0x3a:
  case 0x50:
  case 0x51:
  case 0x52:
  case 0x53:
  case 0x54:
  case 0x55:
  case 0x56:
  case 0x58:
    local_1c = emit_op_load_table(fn,insn);
    break;
  case 0x3b:
    local_1c = emit_op_newtable(fn,insn);
    break;
  case 0x3c:
    local_1c = emit_op_newarray(fn,insn);
    break;
  case 0x3d:
    local_1c = emit_op_newarray(fn,insn);
    break;
  case 0x3e:
  case 0x3f:
  case 0x40:
  case 0x41:
  case 0x42:
  case 0x43:
  case 0x44:
  case 0x46:
  case 0x5a:
    local_1c = emit_op_store_table(fn,insn);
    break;
  case 0x45:
  case 0x47:
    local_1c = emit_op_arrayput_val(fn,insn);
    break;
  case 0x48:
    local_1c = emit_op_cbr(fn,insn);
    break;
  case 0x49:
    local_1c = emit_op_br(fn,insn);
    break;
  case 0x4a:
  case 0x4b:
  case 0x4d:
    local_1c = emit_op_mov(fn,insn);
    break;
  case 0x4c:
    local_1c = emit_op_movif(fn,insn);
    break;
  case 0x4e:
    local_1c = emit_op_movfi(fn,insn);
    break;
  case 0x4f:
    local_1c = emit_op_call(fn,insn);
    break;
  case 0x57:
  case 0x59:
    local_1c = emit_op_arrayget_ikey(fn,insn);
    break;
  case 0x5b:
    local_1c = emit_op_close(fn,insn);
    break;
  case 0x5c:
    local_1c = emit_op_concat(fn,insn);
    break;
  case 0x5d:
    local_1c = emit_op_init(fn,insn);
    break;
  case 0x5e:
    local_1c = emit_op_C__unsafe(fn,insn);
    break;
  case 0x5f:
    local_1c = emit_op_C__new(fn,insn);
    break;
  default:
    pcVar1 = raviX_opcode_name((uint)*(byte *)insn);
    fprintf(__stream,"Unsupported opcode %s\n",pcVar1);
    local_1c = -1;
  }
  return local_1c;
}

Assistant:

static int output_instruction(Function *fn, Instruction *insn)
{
	int rc = 0;

	// Output the IR instruction we are compiling
	raviX_buffer_reset(&fn->tb);
	raviX_output_instruction(insn, &fn->tb);
	raviX_buffer_add_fstring(&fn->body, "// %s\n", fn->tb.buf);
	raviX_buffer_reset(&fn->tb);

	switch (insn->opcode) {
	case op_ret:
		rc = emit_op_ret(fn, insn);
		break;
	case op_br:
		rc = emit_op_br(fn, insn);
		break;
	case op_cbr:
		rc = emit_op_cbr(fn, insn);
		break;
	case op_mov:
	case op_movi:
	case op_movf:
		rc = emit_op_mov(fn, insn);
		break;
	case op_movfi:
		rc = emit_op_movfi(fn, insn);
		break;
	case op_movif:
		rc = emit_op_movif(fn, insn);
		break;
	case op_loadglobal:
	case op_get:
	case op_get_skey:
	case op_get_ikey:
	case op_tget_skey:
	case op_tget_ikey:
	case op_tget: /* TODO custom codegen */
	case op_iaget:
	case op_faget:
		rc = emit_op_load_table(fn, insn);
		break;
	case op_storeglobal:
	case op_put:
	case op_put_skey:
	case op_put_ikey:
	case op_tput_skey:
	case op_tput_ikey:
	case op_tput: /* TODO custom codegen */
	case op_iaput:
	case op_faput:
		rc = emit_op_store_table(fn, insn);
		break;
	case op_call:
		rc = emit_op_call(fn, insn);
		break;

	case op_addff:
	case op_subff:
	case op_mulff:
	case op_divff:

	case op_addii:
	case op_subii:
	case op_mulii:
	case op_divii:
	case op_bandii:
	case op_borii:
	case op_bxorii:
		rc = emit_bin_ii(fn, insn);
		break;

	case op_shlii:
	case op_shrii:
		rc = emit_bitop_ii(fn, insn);
		break;

	case op_eqii:
	case op_ltii:
	case op_leii:
	case op_eqff:
	case op_ltff:
	case op_leff:
		rc = emit_comp_ii(fn, insn);
		break;

	case op_addfi:
	case op_subfi:
	case op_mulfi:
	case op_divfi:
		rc = emit_bin_fi(fn, insn);
		break;

	case op_subif:
	case op_divif:
		rc = emit_bin_if(fn, insn);
		break;

	case op_add:
	case op_sub:
	case op_mul:
		rc = emit_op_arith(fn, insn);
		break;

	case op_not:
		rc = emit_op_not(fn, insn);
		break;

	case op_bnot:
		rc = emit_op_bnot(fn, insn);
		break;

	case op_div:
	case op_idiv:
	case op_band:
	case op_bor:
	case op_bxor:
	case op_shl:
	case op_shr:
	case op_mod:
	case op_pow:
		rc = emit_op_binary(fn, insn);
		break;

	case op_unmi:
	case op_unmf:
		rc = emit_op_unmi_unmf(fn, insn);
		break;

	case op_unm:
		rc = emit_op_unm(fn, insn);
		break;

	case op_eq:
	case op_lt:
	case op_le:
		rc = emit_generic_comp(fn, insn);
		break;

	case op_iaget_ikey:
	case op_faget_ikey:
		rc = emit_op_arrayget_ikey(fn, insn);
		break;

	case op_iaput_ival:
	case op_faput_fval:
		rc = emit_op_arrayput_val(fn, insn);
		break;

	case op_toiarray:
	case op_tofarray:
	case op_totable:
	case op_tostring:
	case op_toclosure:
	case op_toint:
		rc = emit_op_totype(fn, insn);
		break;

	case op_toflt:
		rc = emit_op_toflt(fn, insn);
		break;

	case op_totype:
		rc = emit_op_tousertype(fn, insn);
		break;

	case op_closure:
		rc = emit_op_closure(fn, insn);
		break;

	case op_newtable:
		rc = emit_op_newtable(fn, insn);
		break;

	case op_newiarray:
		rc = emit_op_newarray(fn, insn);
		break;

	case op_newfarray:
		rc = emit_op_newarray(fn, insn);
		break;

	case op_close:
		rc = emit_op_close(fn, insn);
		break;

	case op_len:
	case op_leni:
		rc = emit_op_len(fn, insn);
		break;

	case op_concat:
		rc = emit_op_concat(fn, insn);
		break;

	case op_init:
		rc = emit_op_init(fn, insn);
		break;

	case op_C__unsafe:
		rc = emit_op_C__unsafe(fn, insn);
		break;

	case op_C__new:
		rc = emit_op_C__new(fn, insn);
		break;

	default:
		fprintf(stderr, "Unsupported opcode %s\n", raviX_opcode_name(insn->opcode));
		rc = -1;
	}
	return rc;
}